

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

EdgeIdx __thiscall Escape::CGraph::getEdgeBinary(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  EdgeIdx EVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (v1 < this->nVertices) {
    lVar3 = this->offsets[v1 + 1] + -1;
    EVar1 = this->offsets[v1];
    while (lVar4 = EVar1, lVar4 <= lVar3) {
      lVar2 = (lVar3 + lVar4) / 2;
      if (this->nbors[lVar2] == v2) {
        return lVar2;
      }
      EVar1 = lVar2 + 1;
      if (v2 < this->nbors[lVar2]) {
        lVar3 = lVar2 + -1;
        EVar1 = lVar4;
      }
    }
  }
  return -1;
}

Assistant:

EdgeIdx CGraph::getEdgeBinary(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;

    while (low <= high) {
        mid = (low + high) / 2;
        if (nbors[mid] == v2)
            return mid;
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return -1;
}